

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *x,
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *b)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  Real a;
  int iVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  undefined8 local_a8;
  uint auStack_a0 [4];
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 local_88;
  undefined3 uStack_83;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  this_00 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  auStack_a0[0] = 0;
  auStack_a0[1] = 0;
  auStack_a0[2] = 0;
  auStack_a0[3] = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  local_88 = 0;
  uStack_83 = 0;
  local_80 = 0;
  local_7c = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  (*this->solveTime->_vptr_Timer[3])();
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,b);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  iVar1 = (this->ssvec).super_IdxSet.num;
  local_68.m_backend.data._M_elems[9]._1_3_ = uStack_83;
  local_68.m_backend.data._M_elems._32_5_ = local_88;
  local_68.m_backend.data._M_elems[7]._1_3_ = uStack_8b;
  local_68.m_backend.data._M_elems._24_5_ = uStack_90;
  local_68.m_backend.data._M_elems[4] = auStack_a0[2];
  local_68.m_backend.data._M_elems[5] = auStack_a0[3];
  local_68.m_backend.data._M_elems[0] = (uint)local_a8;
  local_68.m_backend.data._M_elems[1] = local_a8._4_4_;
  local_68.m_backend.data._M_elems[2] = auStack_a0[0];
  local_68.m_backend.data._M_elems[3] = auStack_a0[1];
  local_68.m_backend.exp = local_80;
  local_68.m_backend.neg = (bool)local_7c;
  local_68.m_backend.fpclass = (fpclass_type)local_78;
  local_68.m_backend.prec_elem = local_78._4_4_;
  x->setupStatus = false;
  idx = (x->super_IdxSet).idx;
  vec = (x->
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  (this->ssvec).setupStatus = false;
  iVar1 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::vSolveLeft(&this->
                        super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,&local_68,vec,idx,
                       (this->ssvec).
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(this->ssvec).super_IdxSet.idx,
                       iVar1);
  if (0 < iVar1) {
    x->setupStatus = false;
    (x->super_IdxSet).num = iVar1;
  }
  x->setupStatus = 0 < iVar1;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{
   R epsilon = this->tolerances()->epsilon();

   solveTime->start();

   // copy to SSVec is done to avoid having to deal with the Nonzero datatype
   // TODO change SVec to standard sparse format
   ssvec.assign(b);

   x.clear();
   int sz = ssvec.size(); // see .altValues()
   int n = this->vSolveLeft(epsilon, x.altValues(), x.altIndexMem(),
                            ssvec.altValues(), ssvec.altIndexMem(), sz);

   if(n > 0)
   {
      x.setSize(n);
      x.forceSetup();
   }
   else
      x.unSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount++;
   solveTime->stop();
}